

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

float __thiscall Json::Value::asFloat(Value *this)

{
  double *in_RDI;
  ostringstream oss;
  float local_1d4;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  string local_1b8 [48];
  ostringstream local_188 [388];
  float local_4;
  
  switch(*(undefined1 *)(in_RDI + 1)) {
  case 0:
    local_4 = 0.0;
    break;
  case 1:
    local_4 = (float)(long)*in_RDI;
    break;
  case 2:
    local_4 = (float)(ulong)*in_RDI;
    break;
  case 3:
    local_4 = (float)*in_RDI;
    break;
  default:
    std::__cxx11::ostringstream::ostringstream(local_188);
    std::operator<<((ostream *)local_188,"Value is not convertible to float.");
    std::__cxx11::ostringstream::str();
    throwLogicError((string *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    std::__cxx11::string::~string(local_1b8);
    abort();
  case 5:
    local_1d4 = 1.0;
    if (((ulong)*in_RDI & 1) == 0) {
      local_1d4 = 0.0;
    }
    local_4 = local_1d4;
  }
  return local_4;
}

Assistant:

float Value::asFloat() const {
  switch (type_) {
  case intValue:
    return static_cast<float>(value_.int_);
  case uintValue:
#if !defined(JSON_USE_INT64_DOUBLE_CONVERSION)
    return static_cast<float>(value_.uint_);
#else  // if !defined(JSON_USE_INT64_DOUBLE_CONVERSION)
    return integerToDouble(value_.uint_);
#endif // if !defined(JSON_USE_INT64_DOUBLE_CONVERSION)
  case realValue:
    return static_cast<float>(value_.real_);
  case nullValue:
    return 0.0;
  case booleanValue:
    return value_.bool_ ? 1.0f : 0.0f;
  default:
    break;
  }
  JSON_FAIL_MESSAGE("Value is not convertible to float.");
}